

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

int cmime_message_part_remove(CMimeMessage_T *message,CMimePart_T *part)

{
  CMimePart_T *prev;
  CMimePart_T *tf;
  CMimePart_T *p;
  CMimeListElem_T *elem;
  CMimePart_T *pCStack_18;
  int ret;
  CMimePart_T *part_local;
  CMimeMessage_T *message_local;
  
  elem._4_4_ = 0;
  p = (CMimePart_T *)0x0;
  tf = (CMimePart_T *)0x0;
  prev = (CMimePart_T *)0x0;
  pCStack_18 = part;
  part_local = (CMimePart_T *)message;
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x4c6,"int cmime_message_part_remove(CMimeMessage_T *, CMimePart_T *)");
  }
  if (part == (CMimePart_T *)0x0) {
    __assert_fail("part",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x4c7,"int cmime_message_part_remove(CMimeMessage_T *, CMimePart_T *)");
  }
  p = (CMimePart_T *)message->parts->head;
  do {
    if (p == (CMimePart_T *)0x0) {
LAB_0010a4b1:
      cmime_part_free(prev);
      return elem._4_4_;
    }
    tf = (CMimePart_T *)p->headers;
    if (tf == part) {
      if (part->last == 1) {
        *(undefined2 *)(*(long *)p->content + 0x28) = 1;
      }
      elem._4_4_ = cmime_list_remove(message->parts,(CMimeListElem_T *)p,&prev);
      goto LAB_0010a4b1;
    }
    p = (CMimePart_T *)p->boundary;
  } while( true );
}

Assistant:

int cmime_message_part_remove(CMimeMessage_T *message, CMimePart_T *part) {
    int ret = 0;
    CMimeListElem_T *elem = NULL;
    CMimePart_T *p = NULL;
    CMimePart_T *tf = NULL;
    CMimePart_T *prev = NULL;

    assert(message);
    assert(part);

    elem = cmime_list_head(message->parts);
    while(elem != NULL) {
        p = (CMimePart_T *)cmime_list_data(elem);
        if (p == part) {
            if (part->last == 1) {
                prev = (CMimePart_T *)cmime_list_data(elem->prev);
                prev->last = 1;
            }
            ret = cmime_list_remove(message->parts,elem,(void *)&tf);
            break;
        }
        elem = elem->next;
    }

    cmime_part_free(tf);

    return(ret);
}